

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_custom.cpp
# Opt level: O0

bool ImGui::ButtonColored(char *label,ImVec4 *color,ImVec2 *size)

{
  bool bVar1;
  undefined1 local_60 [7];
  bool ret;
  undefined1 local_50 [8];
  ImVec4 colorPress;
  undefined1 local_30 [8];
  ImVec4 colorHover;
  ImVec2 *size_local;
  ImVec4 *color_local;
  char *label_local;
  
  colorHover._8_8_ = size;
  ImVec4::ImVec4((ImVec4 *)&colorPress.z,1.0,1.0,1.0,color->w);
  _local_30 = ImLerp((ImVec4 *)&colorPress.z,color,0.8);
  ImVec4::ImVec4((ImVec4 *)local_60,0.0,0.0,0.0,color->w);
  _local_50 = ImLerp((ImVec4 *)local_60,color,0.8);
  PushStyleColor(0x15,color);
  PushStyleColor(0x16,(ImVec4 *)local_30);
  PushStyleColor(0x17,(ImVec4 *)local_50);
  bVar1 = Button(label,(ImVec2 *)colorHover._8_8_);
  PopStyleColor(3);
  return bVar1;
}

Assistant:

bool ButtonColored(const char *label, const ImVec4 &color, const ImVec2 &size) {
    ImVec4 colorHover = ImLerp({1, 1, 1, color.w}, color, 0.8f);
    ImVec4 colorPress = ImLerp({0, 0, 0, color.w}, color, 0.8f);
    ImGui::PushStyleColor(ImGuiCol_Button, color);
    ImGui::PushStyleColor(ImGuiCol_ButtonHovered, colorHover);
    ImGui::PushStyleColor(ImGuiCol_ButtonActive, colorPress);
    bool ret = ImGui::Button(label, size);
    ImGui::PopStyleColor(3);
    return ret;
}